

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O0

void __thiscall wasm::CodePushing::CodePushing(CodePushing *this)

{
  CodePushing *this_local;
  
  WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>::
  WalkerPass(&this->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
            );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>).
  super_Pass._vptr_Pass = (_func_int **)&PTR__CodePushing_027163a8;
  LocalAnalyzer::LocalAnalyzer(&this->analyzer);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->numGetsSoFar);
  return;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<CodePushing>();
  }